

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O0

void __thiscall JPG::quantization(JPG *this)

{
  uint uVar1;
  MCU *pMVar2;
  Block *paiVar3;
  uint uVar4;
  Block **ppaiVar5;
  Block *paiVar6;
  uint uVar7;
  uint local_44;
  uint index;
  Block *quantizationTable;
  Block *currentBlock;
  uint local_28;
  uint jj;
  uint ii;
  uint componentID;
  MCU *currentMCU;
  uint j;
  uint i;
  JPG *this_local;
  
  for (currentMCU._4_4_ = 0; currentMCU._4_4_ < this->mcuHeight;
      currentMCU._4_4_ = currentMCU._4_4_ + 1) {
    for (currentMCU._0_4_ = 0; (uint)currentMCU < this->mcuWidth;
        currentMCU._0_4_ = (uint)currentMCU + 1) {
      pMVar2 = this->data;
      uVar1 = this->mcuWidth;
      for (jj = 1; jj < 4; jj = jj + 1) {
        local_28 = 0;
        while( true ) {
          uVar4 = getVerticalSamplingFrequency(this,jj);
          if (uVar4 <= local_28) break;
          currentBlock._4_4_ = 0;
          while( true ) {
            uVar4 = getHorizontalSamplingFrequency(this,jj);
            if (uVar4 <= currentBlock._4_4_) break;
            ppaiVar5 = MCU::operator[](pMVar2 + (currentMCU._4_4_ * uVar1 + (uint)currentMCU),jj);
            paiVar3 = *ppaiVar5;
            uVar4 = getHorizontalSamplingFrequency(this,jj);
            uVar7 = local_28 * uVar4 + currentBlock._4_4_;
            paiVar6 = getQuantizationTableByID(jj);
            for (local_44 = 0; local_44 < 0x40; local_44 = local_44 + 1) {
              paiVar3[uVar7][local_44] = paiVar3[uVar7][local_44] / (*paiVar6)[local_44];
            }
            currentBlock._4_4_ = currentBlock._4_4_ + 1;
          }
          local_28 = local_28 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void JPG::quantization() {
    for (uint i = 0; i < mcuHeight; i++) {
        for (uint j = 0; j < mcuWidth; j++) {
            MCU& currentMCU = data[i * mcuWidth + j];
            //iterate over 每一个component Y, cb cr
            for (uint componentID = 1; componentID <= 3; componentID++) {
                //遍历block
                for(uint ii = 0; ii < getVerticalSamplingFrequency(componentID); ii++) {
                    for(uint jj = 0; jj < getHorizontalSamplingFrequency(componentID); jj++) {
                        Block& currentBlock = currentMCU[componentID][ii * getHorizontalSamplingFrequency(componentID) + jj];
                        const Block& quantizationTable = JPG::getQuantizationTableByID(componentID);

                        for(uint index = 0; index < 64; index++) {
                             currentBlock[index] = currentBlock[index] / quantizationTable[index];
                        }
                    }
                }             
            }
        }
    }  
}